

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverVI.cpp
# Opt level: O2

void __thiscall
chrono::ChIterativeSolverVI::AtIterationEnd
          (ChIterativeSolverVI *this,double mmaxviolation,double mdeltalambda,uint iternum)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong __new_size;
  double local_30;
  double local_28;
  
  if (this->record_violation_history == true) {
    pdVar1 = (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    __new_size = (ulong)iternum;
    local_30 = mdeltalambda;
    local_28 = mmaxviolation;
    if ((long)pdVar1 - (long)pdVar2 >> 3 != __new_size) {
      if (pdVar1 != pdVar2) {
        (this->violation_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar2;
      }
      std::vector<double,_std::allocator<double>_>::resize(&this->violation_history,__new_size);
    }
    pdVar1 = (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pdVar1 - (long)pdVar2 >> 3 != __new_size) {
      if (pdVar1 != pdVar2) {
        (this->dlambda_history).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = pdVar2;
      }
      std::vector<double,_std::allocator<double>_>::resize(&this->dlambda_history,__new_size);
    }
    std::vector<double,_std::allocator<double>_>::push_back(&this->violation_history,&local_28);
    std::vector<double,_std::allocator<double>_>::push_back(&this->dlambda_history,&local_30);
  }
  return;
}

Assistant:

void ChIterativeSolverVI::AtIterationEnd(double mmaxviolation, double mdeltalambda, unsigned int iternum) {
    if (!record_violation_history)
        return;
    if (iternum != violation_history.size()) {
        violation_history.clear();
        violation_history.resize(iternum);
    }
    if (iternum != dlambda_history.size()) {
        dlambda_history.clear();
        dlambda_history.resize(iternum);
    }
    violation_history.push_back(mmaxviolation);
    dlambda_history.push_back(mdeltalambda);
}